

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O3

void ft_var_load_mvar(TT_Face face)

{
  byte *pbVar1;
  ushort uVar2;
  uint uVar3;
  FT_Stream stream;
  FT_Memory memory;
  GX_Blend pGVar4;
  FT_UInt16 FVar5;
  FT_Error FVar6;
  FT_UInt32 FVar7;
  GX_MVarTable pGVar8;
  FT_ULong pos;
  GX_Value pGVar9;
  FT_Short *pFVar10;
  GX_Value pGVar11;
  FT_Error error;
  FT_ULong table_len;
  FT_Error local_44;
  FT_ULong local_40;
  FT_ULong local_38;
  
  stream = (face->root).stream;
  memory = stream->memory;
  pGVar4 = face->blend;
  local_44 = (*face->goto_table)(face,0x4d564152,stream,&local_38);
  if (local_44 == 0) {
    local_40 = FT_Stream_Pos(stream);
    FVar5 = FT_Stream_ReadUShort(stream,&local_44);
    if (((local_44 == 0) && (local_44 = FT_Stream_Skip(stream,2), local_44 == 0)) && (FVar5 == 1)) {
      pGVar8 = (GX_MVarTable)ft_mem_alloc(memory,0x30,&local_44);
      pGVar4->mvar_table = pGVar8;
      if ((local_44 == 0) && (local_44 = FT_Stream_Skip(stream,4), local_44 == 0)) {
        FVar5 = FT_Stream_ReadUShort(stream,&local_44);
        pGVar4->mvar_table->valueCount = FVar5;
        if ((local_44 == 0) && (FVar5 = FT_Stream_ReadUShort(stream,&local_44), local_44 == 0)) {
          pos = FT_Stream_Pos(stream);
          local_44 = tt_var_load_item_variation_store
                               (face,local_40 + FVar5,&pGVar4->mvar_table->itemStore);
          if (local_44 == 0) {
            pGVar9 = (GX_Value)
                     ft_mem_realloc(memory,0x10,0,(ulong)pGVar4->mvar_table->valueCount,(void *)0x0,
                                    &local_44);
            pGVar4->mvar_table->values = pGVar9;
            if (((local_44 == 0) && (local_44 = FT_Stream_Seek(stream,pos), local_44 == 0)) &&
               (FVar6 = FT_Stream_EnterFrame(stream,(ulong)pGVar4->mvar_table->valueCount << 3),
               FVar6 == 0)) {
              pGVar8 = pGVar4->mvar_table;
              pGVar9 = pGVar8->values;
              local_44 = 0;
              if ((pGVar9 != (GX_Value)0x0) && (pGVar8->valueCount != 0)) {
                pGVar11 = pGVar9 + pGVar8->valueCount;
                do {
                  FVar7 = FT_Stream_GetULong(stream);
                  pGVar9->tag = (ulong)FVar7;
                  FVar5 = FT_Stream_GetUShort(stream);
                  pGVar9->outerIndex = FVar5;
                  FVar5 = FT_Stream_GetUShort(stream);
                  pGVar9->innerIndex = FVar5;
                  uVar2 = pGVar9->outerIndex;
                  if (((uVar2 & FVar5) != 0xffff) &&
                     ((uVar3 = (pGVar8->itemStore).dataCount, uVar3 < uVar2 || uVar3 == uVar2 ||
                      ((pGVar8->itemStore).varData[(uint)uVar2].itemCount <= (uint)FVar5)))) {
                    local_44 = 8;
                    break;
                  }
                  pGVar9 = pGVar9 + 1;
                } while (pGVar9 < pGVar11);
              }
              FT_Stream_ExitFrame(stream);
              if (local_44 == 0) {
                pGVar9 = pGVar4->mvar_table->values;
                if ((pGVar9 != (GX_Value)0x0) &&
                   (uVar2 = pGVar4->mvar_table->valueCount, uVar2 != 0)) {
                  pGVar11 = pGVar9 + uVar2;
                  do {
                    pFVar10 = ft_var_get_value_pointer(face,pGVar9->tag);
                    if (pFVar10 != (FT_Short *)0x0) {
                      pGVar9->unmodified = *pFVar10;
                    }
                    pGVar9 = pGVar9 + 1;
                  } while (pGVar9 < pGVar11);
                }
                pbVar1 = (byte *)((long)&face->variation_support + 1);
                *pbVar1 = *pbVar1 | 1;
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void
  ft_var_load_mvar( TT_Face  face )
  {
    FT_Stream  stream = FT_FACE_STREAM( face );
    FT_Memory  memory = stream->memory;

    GX_Blend         blend = face->blend;
    GX_ItemVarStore  itemStore;
    GX_Value         value, limit;

    FT_Error   error;
    FT_UShort  majorVersion;
    FT_ULong   table_len;
    FT_ULong   table_offset;
    FT_UShort  store_offset;
    FT_ULong   records_offset;


    FT_TRACE2(( "MVAR " ));

    error = face->goto_table( face, TTAG_MVAR, stream, &table_len );
    if ( error )
    {
      FT_TRACE2(( "is missing\n" ));
      return;
    }

    table_offset = FT_STREAM_POS();

    /* skip minor version */
    if ( FT_READ_USHORT( majorVersion ) ||
         FT_STREAM_SKIP( 2 )            )
      return;

    if ( majorVersion != 1 )
    {
      FT_TRACE2(( "bad table version %d\n", majorVersion ));
      return;
    }

    if ( FT_NEW( blend->mvar_table ) )
      return;

    /* skip reserved entry and value record size */
    if ( FT_STREAM_SKIP( 4 )                             ||
         FT_READ_USHORT( blend->mvar_table->valueCount ) ||
         FT_READ_USHORT( store_offset )                  )
      return;

    records_offset = FT_STREAM_POS();

    error = tt_var_load_item_variation_store(
              face,
              table_offset + store_offset,
              &blend->mvar_table->itemStore );
    if ( error )
      return;

    if ( FT_NEW_ARRAY( blend->mvar_table->values,
                       blend->mvar_table->valueCount ) )
      return;

    if ( FT_STREAM_SEEK( records_offset )                                ||
         FT_FRAME_ENTER( blend->mvar_table->valueCount * GX_VALUE_SIZE ) )
      return;

    value     = blend->mvar_table->values;
    limit     = FT_OFFSET( value, blend->mvar_table->valueCount );
    itemStore = &blend->mvar_table->itemStore;

    for ( ; value < limit; value++ )
    {
      value->tag        = FT_GET_ULONG();
      value->outerIndex = FT_GET_USHORT();
      value->innerIndex = FT_GET_USHORT();

      /* new in OpenType 1.8.4 */
      if ( value->outerIndex == 0xFFFFU && value->innerIndex == 0xFFFFU )
      {
        /* no variation data for this item */
        continue;
      }

      if ( value->outerIndex >= itemStore->dataCount                  ||
           value->innerIndex >= itemStore->varData[value->outerIndex]
                                                  .itemCount          )
      {
        error = FT_THROW( Invalid_Table );
        break;
      }
    }

    FT_FRAME_EXIT();

    if ( error )
      return;

    FT_TRACE2(( "loaded\n" ));

    value = blend->mvar_table->values;
    limit = FT_OFFSET( value, blend->mvar_table->valueCount );

    /* save original values of the data MVAR is going to modify */
    for ( ; value < limit; value++ )
    {
      FT_Short*  p = ft_var_get_value_pointer( face, value->tag );


      if ( p )
        value->unmodified = *p;
#ifdef FT_DEBUG_LEVEL_TRACE
      else
        FT_TRACE1(( "ft_var_load_mvar: Ignoring unknown tag `%c%c%c%c'\n",
                    (FT_Char)( value->tag >> 24 ),
                    (FT_Char)( value->tag >> 16 ),
                    (FT_Char)( value->tag >> 8 ),
                    (FT_Char)( value->tag ) ));
#endif
    }

    face->variation_support |= TT_FACE_FLAG_VAR_MVAR;
  }